

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

void __thiscall
ddd::DictionaryMLT<false,_true>::DictionaryMLT
          (DictionaryMLT<false,_false> *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *prefixes)

{
  Dictionary *in_RDI;
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  *in_stack_ffffffffffffffb8;
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  *this_00;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffffd8;
  
  Dictionary::Dictionary(in_RDI);
  in_RDI->_vptr_Dictionary = (_func_int **)&PTR__DictionaryMLT_001b4a88;
  this_00 = (unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
             *)(in_RDI + 1);
  std::unique_ptr<ddd::DaTrie<false,true,true>,std::default_delete<ddd::DaTrie<false,true,true>>>::
  unique_ptr<std::default_delete<ddd::DaTrie<false,true,true>>,void>(this_00);
  in_RDI[2]._vptr_Dictionary = (_func_int **)0x0;
  in_RDI[3]._vptr_Dictionary = (_func_int **)0x0;
  in_RDI[4]._vptr_Dictionary = (_func_int **)0x0;
  std::
  vector<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>_>_>
  ::vector((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
            *)0x194d5f);
  *(undefined4 *)&in_RDI[5]._vptr_Dictionary = 0xffffffff;
  in_RDI[6]._vptr_Dictionary = (_func_int **)0x0;
  make_unique<ddd::DaTrie<false,true,true>,std::vector<char_const*,std::allocator<char_const*>>const&>
            (in_stack_ffffffffffffffd8);
  std::
  unique_ptr<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
  ::operator=(this_00,in_stack_ffffffffffffffb8);
  std::
  unique_ptr<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

DictionaryMLT(const std::vector<const char*>& prefixes) {
    prefix_subtrie_ = make_unique<PrefixTrieType>(prefixes);
  }